

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose_test.cpp
# Opt level: O2

void __thiscall
ot::commissioner::cose::CoseTest_CoseSignAndVerify_SignWithExternalData_Test::TestBody
          (CoseTest_CoseSignAndVerify_SignWithExternalData_Test *this)

{
  long *plVar1;
  char *pcVar2;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar;
  undefined1 local_d0 [40];
  ByteArray signature;
  Sign1Message msg;
  ByteArray externalData;
  ErrorCode local_5c;
  mbedtls_pk_context publicKey;
  mbedtls_pk_context privateKey;
  ByteArray content;
  
  local_d0._0_4_ = 0x4030201;
  local_d0._4_2_ = 0x605;
  __l._M_len = 6;
  __l._M_array = local_d0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&content,__l,(allocator_type *)&externalData);
  local_d0._0_4_ = 0x3040506;
  local_d0._4_2_ = 0x102;
  __l_00._M_len = 6;
  __l_00._M_array = local_d0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&externalData,__l_00,(allocator_type *)&publicKey);
  mbedtls_pk_init((mbedtls_pk_context_conflict *)&publicKey);
  mbedtls_pk_init((mbedtls_pk_context_conflict *)&privateKey);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&signature,
             "-----BEGIN CERTIFICATE-----\r\nMIICATCCAaegAwIBAgIIJU8KN/Bcw4cwCgYIKoZIzj0EAwIwGDEWMBQGA1UEAwwN\r\nVGhyZWFkR3JvdXBDQTAeFw0xOTA2MTkyMTM2MTFaFw0yNDA2MTcyMTM2MTFaMBox\r\nGDAWBgNVBAMMD1RocmVhZFJlZ2lzdHJhcjBZMBMGByqGSM49AgEGCCqGSM49AwEH\r\nA0IABCAwhVvoRpELPssVyvhXLT61Zb3GVKFe+vbt66qLnhYIxckQyTogho/IUE03\r\nDxsm+pdZ9nmDu3iGPtqay+pRJPajgdgwgdUwDwYDVR0TBAgwBgEB/wIBAjALBgNV\r\nHQ8EBAMCBeAwbAYDVR0RBGUwY6RhMF8xCzAJBgNVBAYTAlVTMRUwEwYDVQQKDAxU\r\naHJlYWQgR3JvdXAxFzAVBgNVBAMMDlRlc3QgUmVnaXN0cmFyMSAwHgYJKoZIhvcN\r\nAQkBFhFtYXJ0aW5Ac3Rva29lLm5ldDBHBgNVHSMEQDA+gBSS6nZAQEqPq08nC/O8\r\nN52GzXKA+KEcpBowGDEWMBQGA1UEAwwNVGhyZWFkR3JvdXBDQYIIc5C+m8ijatIw\r\nCgYIKoZIzj0EAwIDSAAwRQIgbI7Vrg348jGCENRtT3GbV5FaEqeBaVTeHlkCA99z\r\nRVACIQDGDdZSWXAR+AlfmrDecYnmp5Vgz8eTyjm9ZziIFXPUwA==\r\n-----END CERTIFICATE-----\r\n"
             ,"",(allocator_type *)&gtest_ar_4);
  ParsePublicKey((Error *)local_d0,&publicKey,&signature);
  msg.super_Object._vptr_Object._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&gtest_ar,
             "ParsePublicKey(publicKey, ByteArray{kCertificate, kCertificate + sizeof(kCertificate)})"
             ,"ErrorCode::kNone",(Error *)local_d0,(ErrorCode *)&msg);
  std::__cxx11::string::~string((string *)(local_d0 + 8));
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_d0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&signature,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x7c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&signature,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&signature);
    plVar1 = (long *)CONCAT26(local_d0._6_2_,CONCAT24(local_d0._4_2_,local_d0._0_4_));
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&signature,
             "-----BEGIN PRIVATE KEY-----\r\nMIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQgYJ/MP0dWA9BkYd4W\r\ns6oRY62hDddaEmrAVm5dtAXE/UGhRANCAAQgMIVb6EaRCz7LFcr4Vy0+tWW9xlSh\r\nXvr27euqi54WCMXJEMk6IIaPyFBNNw8bJvqXWfZ5g7t4hj7amsvqUST2\r\n-----END PRIVATE KEY-----\r\n"
             ,"",(allocator_type *)&gtest_ar_4);
  ParsePrivateKey((Error *)local_d0,&privateKey,&signature);
  msg.super_Object._vptr_Object._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&gtest_ar,
             "ParsePrivateKey(privateKey, ByteArray{kPrivateKey, kPrivateKey + sizeof(kPrivateKey)})"
             ,"ErrorCode::kNone",(Error *)local_d0,(ErrorCode *)&msg);
  std::__cxx11::string::~string((string *)(local_d0 + 8));
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_d0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&signature,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x7d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&signature,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&signature);
    plVar1 = (long *)CONCAT26(local_d0._6_2_,CONCAT24(local_d0._4_2_,local_d0._0_4_));
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Sign1Message::Sign1Message(&msg);
  Sign1Message::Init((Error *)local_d0,&msg,0);
  gtest_ar_4.success_ = false;
  gtest_ar_4._1_3_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&gtest_ar,"msg.Init(kInitFlagsNone)","ErrorCode::kNone",(Error *)local_d0,
             (ErrorCode *)&gtest_ar_4);
  std::__cxx11::string::~string((string *)(local_d0 + 8));
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_d0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x82,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    plVar1 = (long *)CONCAT26(local_d0._6_2_,CONCAT24(local_d0._4_2_,local_d0._0_4_));
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  Sign1Message::AddAttribute((Error *)local_d0,&msg,1,-7,1);
  gtest_ar_4.success_ = false;
  gtest_ar_4._1_3_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&gtest_ar,
             "msg.AddAttribute(kHeaderAlgorithm, kAlgEcdsaWithSha256, kProtectOnly)",
             "ErrorCode::kNone",(Error *)local_d0,(ErrorCode *)&gtest_ar_4);
  std::__cxx11::string::~string((string *)(local_d0 + 8));
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_d0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x83,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    plVar1 = (long *)CONCAT26(local_d0._6_2_,CONCAT24(local_d0._4_2_,local_d0._0_4_));
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  Sign1Message::SetContent((Error *)local_d0,&msg,(ByteArray *)&gtest_ar);
  local_5c = kNone;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&gtest_ar_4,"msg.SetContent({})","ErrorCode::kNone",(Error *)local_d0,
             &local_5c);
  std::__cxx11::string::~string((string *)(local_d0 + 8));
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)local_d0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar2 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x84,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    plVar1 = (long *)CONCAT26(local_d0._6_2_,CONCAT24(local_d0._4_2_,local_d0._0_4_));
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  Sign1Message::SetExternalData((Error *)local_d0,&msg,&externalData);
  gtest_ar_4.success_ = false;
  gtest_ar_4._1_3_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&gtest_ar,"msg.SetExternalData(externalData)","ErrorCode::kNone",
             (Error *)local_d0,(ErrorCode *)&gtest_ar_4);
  std::__cxx11::string::~string((string *)(local_d0 + 8));
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_d0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x85,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    plVar1 = (long *)CONCAT26(local_d0._6_2_,CONCAT24(local_d0._4_2_,local_d0._0_4_));
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  Sign1Message::Sign((Error *)local_d0,&msg,(mbedtls_pk_context_conflict *)&privateKey);
  gtest_ar_4.success_ = false;
  gtest_ar_4._1_3_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&gtest_ar,"msg.Sign(privateKey)","ErrorCode::kNone",(Error *)local_d0,
             (ErrorCode *)&gtest_ar_4);
  std::__cxx11::string::~string((string *)(local_d0 + 8));
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_d0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x86,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    plVar1 = (long *)CONCAT26(local_d0._6_2_,CONCAT24(local_d0._4_2_,local_d0._0_4_));
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  Sign1Message::Serialize((Error *)local_d0,&msg,&signature);
  gtest_ar_4.success_ = false;
  gtest_ar_4._1_3_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&gtest_ar,"msg.Serialize(signature)","ErrorCode::kNone",(Error *)local_d0,
             (ErrorCode *)&gtest_ar_4);
  std::__cxx11::string::~string((string *)(local_d0 + 8));
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_d0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x88,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    plVar1 = (long *)CONCAT26(local_d0._6_2_,CONCAT24(local_d0._4_2_,local_d0._0_4_));
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  Sign1Message::Free(&msg);
  Sign1Message::Deserialize((Error *)local_d0,&msg,&signature);
  gtest_ar_4.success_ = false;
  gtest_ar_4._1_3_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&gtest_ar,"Sign1Message::Deserialize(msg, signature)","ErrorCode::kNone",
             (Error *)local_d0,(ErrorCode *)&gtest_ar_4);
  std::__cxx11::string::~string((string *)(local_d0 + 8));
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_d0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x8b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    plVar1 = (long *)CONCAT26(local_d0._6_2_,CONCAT24(local_d0._4_2_,local_d0._0_4_));
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  Sign1Message::SetExternalData((Error *)local_d0,&msg,&externalData);
  gtest_ar_4.success_ = false;
  gtest_ar_4._1_3_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&gtest_ar,"msg.SetExternalData(externalData)","ErrorCode::kNone",
             (Error *)local_d0,(ErrorCode *)&gtest_ar_4);
  std::__cxx11::string::~string((string *)(local_d0 + 8));
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_d0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x8c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    plVar1 = (long *)CONCAT26(local_d0._6_2_,CONCAT24(local_d0._4_2_,local_d0._0_4_));
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  Sign1Message::Validate((Error *)local_d0,&msg,(mbedtls_pk_context_conflict *)&publicKey);
  gtest_ar_4.success_ = false;
  gtest_ar_4._1_3_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&gtest_ar,"msg.Validate(publicKey)","ErrorCode::kNone",(Error *)local_d0,
             (ErrorCode *)&gtest_ar_4);
  std::__cxx11::string::~string((string *)(local_d0 + 8));
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_d0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cose_test.cpp"
               ,0x8d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    plVar1 = (long *)CONCAT26(local_d0._6_2_,CONCAT24(local_d0._4_2_,local_d0._0_4_));
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&externalData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&content.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

TEST(CoseTest, CoseSignAndVerify_SignWithExternalData)
{
    ByteArray content{1, 2, 3, 4, 5, 6};
    ByteArray externalData{6, 5, 4, 3, 2, 1};

    mbedtls_pk_context publicKey;
    mbedtls_pk_context privateKey;

    mbedtls_pk_init(&publicKey);
    mbedtls_pk_init(&privateKey);

    EXPECT_EQ(ParsePublicKey(publicKey, ByteArray{kCertificate, kCertificate + sizeof(kCertificate)}),
              ErrorCode::kNone);
    EXPECT_EQ(ParsePrivateKey(privateKey, ByteArray{kPrivateKey, kPrivateKey + sizeof(kPrivateKey)}), ErrorCode::kNone);

    ByteArray    signature;
    Sign1Message msg;

    EXPECT_EQ(msg.Init(kInitFlagsNone), ErrorCode::kNone);
    EXPECT_EQ(msg.AddAttribute(kHeaderAlgorithm, kAlgEcdsaWithSha256, kProtectOnly), ErrorCode::kNone);
    EXPECT_EQ(msg.SetContent({}), ErrorCode::kNone);
    EXPECT_EQ(msg.SetExternalData(externalData), ErrorCode::kNone);
    EXPECT_EQ(msg.Sign(privateKey), ErrorCode::kNone);

    EXPECT_EQ(msg.Serialize(signature), ErrorCode::kNone);
    msg.Free();

    EXPECT_EQ(Sign1Message::Deserialize(msg, signature), ErrorCode::kNone);
    EXPECT_EQ(msg.SetExternalData(externalData), ErrorCode::kNone);
    EXPECT_EQ(msg.Validate(publicKey), ErrorCode::kNone);
}